

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O0

bool __thiscall LSM_tree::del(LSM_tree *this,uint64_t key)

{
  bool bVar1;
  undefined1 local_40 [8];
  string s;
  uint64_t key_local;
  LSM_tree *this_local;
  
  s.field_2._8_8_ = key;
  bVar1 = find(this,key);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_40);
    put(this,s.field_2._8_8_,(string *)local_40,true);
    std::__cxx11::string::~string((string *)local_40);
  }
  return bVar1;
}

Assistant:

bool LSM_tree::del(uint64_t key) {
    //这个find是找 确实有没有这个 如果memtable有key 但标为被删就算没找到
    //如果要去文件里找看最大时间码的有没有标记未被删了的
    //cout<<"del"<<key<<endl;
    if (!find(key)) return false;
    std::string s;
    put(key, s, true);
    return true;
}